

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_create_table.cpp
# Opt level: O1

PhysicalOperator * __thiscall
duckdb::DuckCatalog::PlanCreateTableAs
          (DuckCatalog *this,ClientContext *context,PhysicalPlanGenerator *planner,
          LogicalCreateTable *op,PhysicalOperator *plan)

{
  pointer *pprVar1;
  SchemaCatalogEntry *pSVar2;
  iterator __position;
  bool bVar3;
  bool bVar4;
  int32_t iVar5;
  TaskScheduler *this_00;
  pointer pPVar6;
  PhysicalOperator *pPVar7;
  bool parallel;
  bool local_39;
  reference_wrapper<duckdb::PhysicalOperator> local_38;
  
  bVar3 = PhysicalPlanGenerator::PreserveInsertionOrder(context,plan);
  bVar4 = PhysicalPlanGenerator::UseBatchIndex(context,plan);
  this_00 = TaskScheduler::GetScheduler(context);
  iVar5 = TaskScheduler::NumberOfThreads(this_00);
  if ((bVar3) && (bVar4)) {
    pSVar2 = op->schema;
    local_38._M_data = (PhysicalOperator *)((ulong)local_38._M_data._4_4_ << 0x20);
    pPVar6 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
             operator->(&planner->physical_plan);
    pPVar7 = PhysicalPlan::
             Make<duckdb::PhysicalBatchInsert,duckdb::LogicalCreateTable&,duckdb::SchemaCatalogEntry&,duckdb::unique_ptr<duckdb::BoundCreateTableInfo,std::default_delete<duckdb::BoundCreateTableInfo>,true>,unsigned_int>
                       (pPVar6,op,pSVar2,&op->info,(uint *)&local_38);
  }
  else {
    local_39 = 1 < iVar5 && !bVar3;
    pSVar2 = op->schema;
    local_38._M_data = (PhysicalOperator *)((ulong)local_38._M_data._4_4_ << 0x20);
    pPVar6 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
             operator->(&planner->physical_plan);
    pPVar7 = PhysicalPlan::
             Make<duckdb::PhysicalInsert,duckdb::LogicalCreateTable&,duckdb::SchemaCatalogEntry&,duckdb::unique_ptr<duckdb::BoundCreateTableInfo,std::default_delete<duckdb::BoundCreateTableInfo>,true>,unsigned_int,bool&>
                       (pPVar6,op,pSVar2,&op->info,(uint *)&local_38,&local_39);
  }
  __position._M_current =
       (pPVar7->children).
       super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pPVar7->children).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_38._M_data = plan;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&pPVar7->children,__position,&local_38);
  }
  else {
    (__position._M_current)->_M_data = plan;
    pprVar1 = &(pPVar7->children).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return pPVar7;
}

Assistant:

PhysicalOperator &DuckCatalog::PlanCreateTableAs(ClientContext &context, PhysicalPlanGenerator &planner,
                                                 LogicalCreateTable &op, PhysicalOperator &plan) {
	bool parallel_streaming_insert = !PhysicalPlanGenerator::PreserveInsertionOrder(context, plan);
	bool use_batch_index = PhysicalPlanGenerator::UseBatchIndex(context, plan);
	auto num_threads = TaskScheduler::GetScheduler(context).NumberOfThreads();
	if (!parallel_streaming_insert && use_batch_index) {
		auto &insert = planner.Make<PhysicalBatchInsert>(op, op.schema, std::move(op.info), 0U);
		D_ASSERT(op.children.size() == 1);
		insert.children.push_back(plan);
		return insert;
	}

	auto parallel = parallel_streaming_insert && num_threads > 1;
	auto &insert = planner.Make<PhysicalInsert>(op, op.schema, std::move(op.info), 0U, parallel);
	D_ASSERT(op.children.size() == 1);
	insert.children.push_back(plan);
	return insert;
}